

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_net.cpp
# Opt level: O2

SOCKET UDPsocket(void)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  
  iVar1 = socket(2,2,0x11);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    I_FatalError("can\'t create socket: %s",pcVar3);
  }
  return iVar1;
}

Assistant:

SOCKET UDPsocket (void)
{
	SOCKET s;
		
	// allocate a socket
	s = socket (PF_INET, SOCK_DGRAM, IPPROTO_UDP);
	if (s == INVALID_SOCKET)
		I_FatalError ("can't create socket: %s", neterror ());

	return s;
}